

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O2

void __thiscall crnlib::dds_comp::~dds_comp(dds_comp *this)

{
  ~dds_comp(this);
  operator_delete(this);
  return;
}

Assistant:

dds_comp::~dds_comp()
    {
        crnlib_delete(m_pQDXT_state);
    }